

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sjio.cpp
# Opt level: O3

void WriteToSldFile(int pageNum,int value,char type,char *symbol)

{
  char *pcVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  undefined4 in_register_00000034;
  undefined4 in_register_0000003c;
  ulong uVar5;
  char *pcVar6;
  pointer pTVar7;
  TextFilePos local_58;
  undefined8 local_40;
  undefined8 local_38;
  
  local_38 = CONCAT44(in_register_0000003c,pageNum);
  local_40 = CONCAT44(in_register_00000034,value);
  if (type == '\0') {
    return;
  }
  if (FP_SourceLevelDebugging == (FILE *)0x0) {
    return;
  }
  if (symbol == (char *)0x0) {
    symbol = "";
  }
  if (sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
      super__Vector_impl_data._M_start ==
      sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    __assert_fail("!sourcePosStack.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/z00m128[P]sjasmplus/sjasm/sjio.cpp"
                  ,0x5af,"void WriteToSldFile(int, int, char, const char *)");
  }
  uVar3 = ((long)sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  uVar5 = (ulong)IncludeLevel;
  if (uVar3 < uVar5 || uVar3 - uVar5 == 0) {
    pTVar7 = sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
             super__Vector_impl_data._M_finish + -1;
  }
  else {
    pTVar7 = sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
             super__Vector_impl_data._M_start + uVar5;
    if ((ulong)(long)(IncludeLevel + 1) <= uVar3 && uVar3 - (long)(IncludeLevel + 1) != 0) {
      local_58.colEnd =
           sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
           super__Vector_impl_data._M_finish[-1].colEnd;
      local_58.filename =
           sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
           super__Vector_impl_data._M_finish[-1].filename;
      local_58.line =
           sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
           super__Vector_impl_data._M_finish[-1].line;
      local_58.colBegin =
           sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
           super__Vector_impl_data._M_finish[-1].colBegin;
      goto LAB_0012b3a3;
    }
  }
  TextFilePos::TextFilePos(&local_58,(char *)0x0,0);
LAB_0012b3a3:
  pcVar1 = local_58.filename;
  pcVar6 = "";
  if (local_58.filename != (char *)0x0) {
    iVar2 = strcmp(local_58.filename,pTVar7->filename);
    pcVar6 = "";
    if (iVar2 != 0) {
      pcVar6 = pcVar1;
    }
  }
  lVar4 = (ulong)(pTVar7->colEnd == 0) * 3;
  if (pTVar7->colBegin == 0) {
    lVar4 = 6;
  }
  snprintf(sldMessage_sourcePos,0x3ff,"%d:%d:%d" + lVar4,(ulong)pTVar7->line);
  lVar4 = (ulong)(local_58.colEnd == 0) * 3;
  if (local_58.colBegin == 0) {
    lVar4 = 6;
  }
  snprintf(sldMessage_definitionPos,0x3ff,"%d:%d:%d" + lVar4,local_58._8_8_ & 0xffffffff);
  snprintf(sldMessage,0x1000,"%s|%s|%s|%s|%d|%d|%c|%s\n",pTVar7->filename,sldMessage_sourcePos,
           pcVar6,sldMessage_definitionPos,local_38,local_40,(ulong)(uint)(int)type,symbol);
  fputs(sldMessage,(FILE *)FP_SourceLevelDebugging);
  return;
}

Assistant:

void WriteToSldFile(int pageNum, int value, char type, const char* symbol) {
	// SLD line format:
	// <file name>|<source line>|<definition file>|<definition line>|<page number>|<value>|<type>|<data>\n
	//
	// * string <file name> can't be empty (empty is for specific "control lines" with different format)
	//
	// * unsigned <source line> when <file name> is not empty, line number (in human way starting at 1)
	// The actual format is "%d[:%d[:%d]]", first number is always line. If second number is present,
	// that's the start column (in bytes), and if also third number is present, that's end column.
	//
	// * string <definition file> where the <definition line> was defined, if empty, it's equal to <file name>
	//
	// * unsigned <definition line> explicit zero value in regular source, but inside macros
	// the <source line> keeps pointing at line emitting the macro, while this value points
	// to source with actual definitions of instructions/etc (nested macro in macro <source line>
	// still points at the top level source which initiated it).
	// The format is again "%d[:%d[:%d]]" same as <source line>, optionally including the columns data.
	//
	// * int <value> is not truncated to page range, but full 16b Z80 address or even 32b value (equ)
	//
	// * string <data> content depends on char <type>:
	// 'T' = instruction Trace, empty data
	// 'D' = EQU symbol, <data> is the symbol name ("label")
	// 'F' = function label, <data> is the symbol name
	// 'Z' = device (memory model) changed, <data> has special custom formatting
	//
	// 'Z' device <data> format:
	// pages.size:<page size>,pages.count:<page count>,slots.count:<slots count>[,slots.adr:<slot0 adr>,...,<slotLast adr>]
	// unsigned <page size> is also any-slot size in current version.
	// unsigned <page count> and <slots count> define how many pages/slots there are
	// uint16_t <slotX adr> is starting address of slot memory region in Z80 16b addressing
	//
	// specific lines (<file name> string was empty):
	// |SLD.data.version|<version number>
	// <version number> is SLD file format version, currently should be 0
	// ||<anything till EOL>
	// comment line, not to be parsed
	if (nullptr == FP_SourceLevelDebugging || !type) return;
	if (nullptr == symbol) symbol = WriteToSld_noSymbol;

	assert(!sourcePosStack.empty());
	const bool outside_source = (sourcePosStack.size() <= size_t(IncludeLevel));
	const bool has_def_pos = !outside_source && (size_t(IncludeLevel + 1) < sourcePosStack.size());
	const TextFilePos & curPos = outside_source ? sourcePosStack.back() : sourcePosStack.at(IncludeLevel);
	const TextFilePos & defPos = has_def_pos ? sourcePosStack.back() : TextFilePos();

	const char* macroFN = defPos.filename && strcmp(defPos.filename, curPos.filename) ? defPos.filename : "";
	WriteToSldFile_TextFilePos(sldMessage_sourcePos, curPos);
	WriteToSldFile_TextFilePos(sldMessage_definitionPos, defPos);
	snprintf(sldMessage, LINEMAX2, "%s|%s|%s|%s|%d|%d|%c|%s\n",
				curPos.filename, sldMessage_sourcePos, macroFN, sldMessage_definitionPos,
				pageNum, value, type, symbol);
	fputs(sldMessage, FP_SourceLevelDebugging);
}